

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O2

void __thiscall puppup::Game::checkWinner(Game *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = this->turn_;
  lVar3 = (this->state_).score;
  uVar2 = uVar1 ^ 1;
  for (lVar4 = 0; lVar4 != 0xd8; lVar4 = lVar4 + 8) {
    lVar3 = lVar3 + *(long *)((long)(this->racks_)._M_elems[uVar2]._M_elems + lVar4) *
                    *(long *)((long)&scores + lVar4);
    (this->state_).score = lVar3;
  }
  if (0 < lVar3) {
    this->winner_ = uVar1;
    return;
  }
  if (-1 < lVar3) {
    this->winner_ = 2;
    return;
  }
  this->winner_ = uVar2;
  return;
}

Assistant:

void checkWinner() {
        for (chr i = 0; i < 27; ++i) {
            state_.score += scores[i] * racks_[turn_ ^ 1][i];
        }
        // print(racks_[turn_]);
        // print(racks_[turn_ ^ 1]);
        // std::cerr << state_.score << std::endl;
        if (state_.score > 0) {
            winner_ = turn_;
        } else if (state_.score < 0) {
            winner_ = turn_ ^ 1;
        } else {
            winner_ = 2;
        }
    }